

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O0

QTransform * __thiscall QTransform::inverted(QTransform *this,bool *invertible)

{
  bool bVar1;
  bool bVar2;
  TransformationType TVar3;
  byte *in_RDX;
  QTransform *in_RSI;
  QTransform *in_RDI;
  long in_FS_OFFSET;
  qreal det;
  bool inv;
  QTransform *pQVar4;
  undefined4 in_stack_ffffffffffffff30;
  bool local_b9;
  QTransform *in_stack_ffffffffffffff70;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->m_matrix[2][2] = -NAN;
  *(undefined1 **)&in_RDI->field_0x48 = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_matrix[2][0] = -NAN;
  in_RDI->m_matrix[2][1] = -NAN;
  in_RDI->m_matrix[1][1] = -NAN;
  in_RDI->m_matrix[1][2] = -NAN;
  in_RDI->m_matrix[0][2] = -NAN;
  in_RDI->m_matrix[1][0] = -NAN;
  in_RDI->m_matrix[0][0] = -NAN;
  in_RDI->m_matrix[0][1] = -NAN;
  pQVar4 = in_RDI;
  QTransform(in_RDI);
  local_b9 = true;
  TVar3 = inline_type(in_RDI);
  if (TVar3 != TxNone) {
    if (TVar3 == TxTranslate) {
      in_RDI->m_matrix[2][0] = -in_RSI->m_matrix[2][0];
      in_RDI->m_matrix[2][1] = -in_RSI->m_matrix[2][1];
    }
    else if (TVar3 == TxScale) {
      bVar2 = qFuzzyIsNull((double)in_RDI);
      bVar1 = qFuzzyIsNull((double)in_RDI);
      local_b9 = ((bVar2 ^ 0xffU) & 1 & (bVar1 ^ 0xffU) & 1) != 0;
      if (local_b9) {
        in_RDI->m_matrix[0][0] = 1.0 / in_RSI->m_matrix[0][0];
        in_RDI->m_matrix[1][1] = 1.0 / in_RSI->m_matrix[1][1];
        in_RDI->m_matrix[2][0] = -in_RSI->m_matrix[2][0] * in_RDI->m_matrix[0][0];
        in_RDI->m_matrix[2][1] = -in_RSI->m_matrix[2][1] * in_RDI->m_matrix[1][1];
      }
    }
    else {
      determinant(in_RSI);
      bVar2 = qFuzzyIsNull((double)in_RDI);
      local_b9 = (bool)((bVar2 ^ 0xffU) & 1);
      if (local_b9 != false) {
        adjoint(in_stack_ffffffffffffff70);
        operator/((QTransform *)CONCAT44(TVar3,in_stack_ffffffffffffff30),(qreal)in_RSI);
        memcpy(in_RDI,local_58,0x4a);
      }
    }
  }
  if (in_RDX != (byte *)0x0) {
    *in_RDX = local_b9;
  }
  if (local_b9 != false) {
    *(ushort *)&in_RDI->field_0x48 =
         *(ushort *)&in_RDI->field_0x48 & 0xffe0 | *(ushort *)&in_RSI->field_0x48 & 0x1f;
    *(ushort *)&in_RDI->field_0x48 =
         *(ushort *)&in_RDI->field_0x48 & 0xfc1f | (*(ushort *)&in_RSI->field_0x48 >> 5 & 0x1f) << 5
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QTransform QTransform::inverted(bool *invertible) const
{
    QTransform invert;
    bool inv = true;

    switch(inline_type()) {
    case TxNone:
        break;
    case TxTranslate:
        invert.m_matrix[2][0] = -m_matrix[2][0];
        invert.m_matrix[2][1] = -m_matrix[2][1];
        break;
    case TxScale:
        inv = !qFuzzyIsNull(m_matrix[0][0]);
        inv &= !qFuzzyIsNull(m_matrix[1][1]);
        if (inv) {
            invert.m_matrix[0][0] = 1. / m_matrix[0][0];
            invert.m_matrix[1][1] = 1. / m_matrix[1][1];
            invert.m_matrix[2][0] = -m_matrix[2][0] * invert.m_matrix[0][0];
            invert.m_matrix[2][1] = -m_matrix[2][1] * invert.m_matrix[1][1];
        }
        break;
    default:
        // general case
        qreal det = determinant();
        inv = !qFuzzyIsNull(det);
        if (inv)
            invert = adjoint() / det;
        break;
    }

    if (invertible)
        *invertible = inv;

    if (inv) {
        // inverting doesn't change the type
        invert.m_type = m_type;
        invert.m_dirty = m_dirty;
    }

    return invert;
}